

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterValidator.cpp
# Opt level: O2

Result * CoreML::validateInt64Parameter
                   (Result *__return_storage_ptr__,string *parameterName,
                   Int64Parameter *int64Parameter,bool shouldBePositive)

{
  long __val;
  Rep *pRVar1;
  long lVar2;
  long __val_00;
  Int64Set *pIVar3;
  long *plVar4;
  Int64Range *pIVar5;
  long *plVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string err;
  string local_48;
  
  bVar7 = !shouldBePositive;
  __val = int64Parameter->defaultvalue_;
  if (0 < __val || bVar7) {
    if (int64Parameter->_oneof_case_[0] == 10) {
      pIVar5 = Specification::Int64Parameter::range(int64Parameter);
      lVar2 = pIVar5->minvalue_;
      if (0 < lVar2 || bVar7) {
        __val_00 = pIVar5->maxvalue_;
        if (0 < __val_00 || bVar7) {
          if (lVar2 <= __val && __val <= __val_00) goto LAB_0056d02f;
          std::__cxx11::to_string(&local_48,__val);
          std::operator+(&bStack_c8,"Specified Default Value (",&local_48);
          std::operator+(&local_a8,&bStack_c8,") out of Allowed Value Range for \'");
          std::operator+(&local_88,&local_a8,parameterName);
          std::operator+(&err,&local_88,"\'");
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&bStack_c8);
          std::__cxx11::string::~string((string *)&local_48);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
        else {
          std::__cxx11::to_string(&local_48,__val_00);
          std::operator+(&bStack_c8,"Non-positive max value (",&local_48);
          std::operator+(&local_a8,&bStack_c8,") in Allowed Value Range for \'");
          std::operator+(&local_88,&local_a8,parameterName);
          std::operator+(&err,&local_88,"\' is not allowed.");
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&bStack_c8);
          std::__cxx11::string::~string((string *)&local_48);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
        }
      }
      else {
        std::__cxx11::to_string(&local_48,lVar2);
        std::operator+(&bStack_c8,"Non-positive min value (",&local_48);
        std::operator+(&local_a8,&bStack_c8,") in Allowed Value Range for \'");
        std::operator+(&local_88,&local_a8,parameterName);
        std::operator+(&err,&local_88,"\' is not allowed.");
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&bStack_c8);
        std::__cxx11::string::~string((string *)&local_48);
        Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
      }
    }
    else {
      if (int64Parameter->_oneof_case_[0] != 0xb) {
LAB_0056d02f:
        Result::Result(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      pIVar3 = Specification::Int64Parameter::set(int64Parameter);
      pRVar1 = (pIVar3->values_).rep_;
      plVar6 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        plVar6 = (long *)0x0;
      }
      plVar4 = pRVar1->elements + (pIVar3->values_).current_size_;
      if (pRVar1 == (Rep *)0x0) {
        plVar4 = (long *)0x0;
      }
      do {
        if (plVar6 == plVar4) {
          std::__cxx11::to_string(&local_48,__val);
          std::operator+(&bStack_c8,"Specified Default Value (",&local_48);
          std::operator+(&local_a8,&bStack_c8,") not found in Allowed Values Set for \'");
          std::operator+(&local_88,&local_a8,parameterName);
          std::operator+(&err,&local_88,"\'");
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&bStack_c8);
          std::__cxx11::string::~string((string *)&local_48);
          Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
          goto LAB_0056cc6c;
        }
        lVar2 = *plVar6;
        if (lVar2 == __val) goto LAB_0056d02f;
        plVar6 = plVar6 + 1;
      } while (0 < lVar2 || bVar7);
      std::__cxx11::to_string(&local_48,lVar2);
      std::operator+(&bStack_c8,"Non-positive value (",&local_48);
      std::operator+(&local_a8,&bStack_c8,") in Allowed Values Set for \'");
      std::operator+(&local_88,&local_a8,parameterName);
      std::operator+(&err,&local_88,"\' is not allowed.");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&bStack_c8);
      std::__cxx11::string::~string((string *)&local_48);
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
    }
  }
  else {
    std::__cxx11::to_string(&local_48,__val);
    std::operator+(&bStack_c8,"Default Value (",&local_48);
    std::operator+(&local_a8,&bStack_c8,") for \'");
    std::operator+(&local_88,&local_a8,parameterName);
    std::operator+(&err,&local_88,"\' expected to be a positive value.");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_48);
    Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&err);
  }
LAB_0056cc6c:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result CoreML::validateInt64Parameter(const std::string& parameterName, const Specification::Int64Parameter& int64Parameter, bool shouldBePositive) {

    const ::google::protobuf::int64 defaultValue = int64Parameter.defaultvalue();

    if (shouldBePositive) {
        if (defaultValue <= 0) {
            std::string err = "Default Value (" + std::to_string(defaultValue) + ") for '" + parameterName + "' expected to be a positive value.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }

    if (int64Parameter.has_set()) {
        bool valueFoundInSet = false;
        for (const auto &value : int64Parameter.set().values()) {
            if (value == defaultValue) {
                valueFoundInSet = true;
                break;
            }
            if (value <= 0 && shouldBePositive) {
                std::string err = "Non-positive value (" + std::to_string(value) + ") in Allowed Values Set for '" + parameterName + "' is not allowed.";
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
            }
        }
        if (false == valueFoundInSet) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") not found in Allowed Values Set for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
    }
    else if (int64Parameter.has_range()) {
        const Specification::Int64Range& range = int64Parameter.range();

        if (range.minvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive min value (" + std::to_string(range.minvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.maxvalue() <= 0 && shouldBePositive) {
            std::string err = "Non-positive max value (" + std::to_string(range.maxvalue()) + ") in Allowed Value Range for '" + parameterName + "' is not allowed.";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (defaultValue < range.minvalue() || defaultValue > range.maxvalue()) {
            std::string err = "Specified Default Value (" + std::to_string(defaultValue) + ") out of Allowed Value Range for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }

        if (range.minvalue() > range.maxvalue()) {
            std::string err = "Specified minimum value (" + std::to_string(defaultValue) + ") greater than maximum value for '" + parameterName + "'";
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);

        }
    }

    return Result();
}